

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_4::CreatePixmapSurfaceCase::executeForConfig
          (CreatePixmapSurfaceCase *this,EGLDisplay display,EGLConfig config)

{
  ostringstream *poVar1;
  bool bVar2;
  NativeDisplay *pNVar3;
  EGLint EVar4;
  deUint32 dVar5;
  int iVar6;
  Library *egl;
  NativePixmapFactory *pNVar7;
  NotSupportedError *this_00;
  undefined4 extraout_var;
  undefined8 uVar8;
  EGLSurface surface_00;
  undefined4 extraout_var_01;
  char *platformExt;
  EGLint pixmapHeight;
  EGLint pixmapWidth;
  UniqueSurface surface;
  int local_1ec;
  long *local_1e8;
  int local_1dc;
  TestLog *local_1d8;
  EGLConfig local_1d0;
  UniqueSurface local_1c8;
  undefined1 local_1b0 [384];
  Library *egl_00;
  undefined4 extraout_var_00;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  local_1d8 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
              )->m_log;
  local_1d0 = config;
  EVar4 = eglu::getConfigID(egl,display,config);
  pNVar7 = eglu::selectNativePixmapFactory
                     (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                      m_nativeDisplayFactory,
                      ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_cmdLine);
  if (this->m_useLegacyCreate == true) {
    if ((*(uint *)(pNVar7 + 0x48) & 1) != 0) {
LAB_0022e3bc:
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = local_1d8;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Creating pixmap surface with config ID ",0x27);
      std::ostream::operator<<(poVar1,EVar4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"init",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0xc3);
      local_1e8 = (long *)(**(code **)(*(long *)pNVar7 + 0x20))
                                    (pNVar7,(((this->super_SimpleConfigCase).super_TestCase.
                                             m_eglTestCtx)->m_nativeDisplay).
                                            super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                            .m_data.ptr,display,local_1d0,0,0x40,0x40);
      pNVar3 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      bVar2 = this->m_useLegacyCreate;
      iVar6 = (*pNVar3->_vptr_NativeDisplay[2])(pNVar3);
      egl_00 = (Library *)CONCAT44(extraout_var,iVar6);
      if (bVar2 == false) {
        platformExt = (char *)(pNVar3->m_platformExtension)._M_string_length;
        if (platformExt != (char *)0x0) {
          platformExt = (pNVar3->m_platformExtension)._M_dataplus._M_p;
        }
        checkEGLPlatformSupport(egl_00,platformExt);
        uVar8 = (**(code **)(*local_1e8 + 0x18))();
        iVar6 = (*egl_00->_vptr_Library[0xd])(egl_00,display,local_1d0,uVar8,0);
        surface_00 = (EGLSurface)CONCAT44(extraout_var_01,iVar6);
        dVar5 = (*egl_00->_vptr_Library[0x1f])(egl_00);
        eglu::checkError(dVar5,"eglCreatePlatformPixmapSurfaceEXT() failed",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                         ,0x65);
      }
      else {
        uVar8 = (**(code **)(*local_1e8 + 0x10))();
        iVar6 = (*egl_00->_vptr_Library[0xb])(egl_00,display,local_1d0,uVar8,0);
        surface_00 = (EGLSurface)CONCAT44(extraout_var_00,iVar6);
        dVar5 = (*egl_00->_vptr_Library[0x1f])(egl_00);
        eglu::checkError(dVar5,"eglCreatePixmapSurface() failed",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                         ,0x5e);
      }
      eglu::UniqueSurface::UniqueSurface(&local_1c8,egl,display,surface_00);
      local_1dc = 0;
      local_1ec = 0;
      (*egl->_vptr_Library[0x2b])(egl,display,local_1c8.m_surface,0x3057);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"querySurface(display, *surface, EGL_WIDTH, &pixmapWidth)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0xcd);
      (*egl->_vptr_Library[0x2b])(egl,display,local_1c8.m_surface,0x3056,&local_1ec);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"querySurface(display, *surface, EGL_HEIGHT, &pixmapHeight)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                       ,0xce);
      if ((local_1dc < 1) || (local_1ec < 1)) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_1d8;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"  Fail, invalid surface size ",0x1d);
        std::ostream::operator<<(poVar1,local_1dc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
        std::ostream::operator<<(poVar1,local_1ec);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Invalid surface size");
      }
      else {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = local_1d8;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  Pass",6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      }
      eglu::UniqueSurface::~UniqueSurface(&local_1c8);
      if (local_1e8 != (long *)0x0) {
        (**(code **)(*local_1e8 + 8))();
      }
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Native pixmap doesn\'t support legacy eglCreatePixmapSurface()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
               ,0xba);
  }
  else {
    if ((*(uint *)(pNVar7 + 0x48) & 2) != 0) goto LAB_0022e3bc;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Native pixmap doesn\'t support eglCreatePlatformPixmapSurfaceEXT()",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
               ,0xbf);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		TestLog&							log				= m_testCtx.getLog();
		EGLint								id				= eglu::getConfigID(egl, display, config);
		const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		// \todo [2011-03-23 pyry] Iterate thru all possible combinations of EGL_RENDER_BUFFER, EGL_VG_COLORSPACE and EGL_VG_ALPHA_FORMAT

		if (m_useLegacyCreate)
		{
			if ((pixmapFactory.getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support legacy eglCreatePixmapSurface()");
		}
		else
		{
			if ((pixmapFactory.getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_PLATFORM) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support eglCreatePlatformPixmapSurfaceEXT()");
		}

		log << TestLog::Message << "Creating pixmap surface with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		{
			const int							width			= 64;
			const int							height			= 64;
			de::UniquePtr<eglu::NativePixmap>	pixmap			(pixmapFactory.createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));
			eglu::UniqueSurface					surface			(egl, display, createPixmapSurface(display, config, m_eglTestCtx.getNativeDisplay(), *pixmap, m_useLegacyCreate));
			EGLint								pixmapWidth		= 0;
			EGLint								pixmapHeight	= 0;

			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_WIDTH,		&pixmapWidth));
			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_HEIGHT,	&pixmapHeight));

			if (pixmapWidth <= 0 || pixmapHeight <= 0)
			{
				log << TestLog::Message << "  Fail, invalid surface size " << pixmapWidth << "x" << pixmapHeight << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface size");
			}
			else
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}